

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::truncSatToUI64(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  float fVar5;
  double dVar6;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  anon_union_16_5_9943fe1e_for_Literal_0 local_38;
  long local_28;
  double local_20;
  
  uVar1 = (this->type).id;
  if (uVar1 == 5) {
    Literal((Literal *)&local_38.func,this);
    if (local_28 != 5) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x15d,"Literal wasm::Literal::castToI64()");
    }
    local_40 = 3;
    dVar6 = (double)CONCAT44(local_38.i64._4_4_,local_38.i32);
    local_50.i64 = (int64_t)dVar6;
    local_20 = dVar6;
    if (NAN(dVar6)) {
      sVar4 = 0;
    }
    else {
      bVar2 = isInRangeI64TruncU((int64_t)dVar6);
      if (bVar2) {
        dVar6 = ::trunc(local_20);
        sVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
      }
      else {
        sVar4 = (long)~(ulong)dVar6 >> 0x3f;
      }
    }
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len = sVar4;
  }
  else {
    if (uVar1 != 4) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x338);
    }
    Literal((Literal *)&local_38.func,this);
    if (local_28 != 4) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x156,"Literal wasm::Literal::castToI32()");
    }
    local_40 = 2;
    local_50.i32 = local_38.i32;
    local_20 = (double)CONCAT44(local_20._4_4_,local_38.i32);
    if (NAN((float)local_38.i32)) {
      uVar3 = 0;
    }
    else {
      bVar2 = isInRangeI64TruncU(local_38.i32);
      if (bVar2) {
        fVar5 = truncf(local_20._0_4_);
        uVar3 = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
      }
      else {
        uVar3 = -(ulong)(-1 < local_38.i32);
      }
    }
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len = uVar3;
  }
  (__return_storage_ptr__->type).id = 3;
  ~Literal((Literal *)&local_50.func);
  ~Literal((Literal *)&local_38.func);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToUI64() const {
  if (type == Type::f32) {
    return saturating_trunc<float, uint64_t, isInRangeI64TruncU>(
      Literal(*this).castToI32().geti32());
  }
  if (type == Type::f64) {
    return saturating_trunc<double, uint64_t, isInRangeI64TruncU>(
      Literal(*this).castToI64().geti64());
  }
  WASM_UNREACHABLE("invalid type");
}